

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * declaration_specifiers(dmr_C *C,token *token,decl_state *ctx)

{
  int iVar1;
  symbol *psVar2;
  bool bVar3;
  symbol *type;
  symbol *base;
  symbol *s;
  int local_30;
  int size;
  int cls;
  int seen;
  decl_state *ctx_local;
  token *token_local;
  dmr_C *C_local;
  
  size = 0;
  local_30 = 0;
  s._4_4_ = 0;
  ctx_local = (decl_state *)token;
  do {
    while( true ) {
      if (((((uint)(ctx_local->ctype).modifiers & 0x3f) != 2) ||
          (psVar2 = dmrC_lookup_symbol((ident *)(ctx_local->ctype).contexts,NS_SYMBOL|NS_TYPEDEF),
          psVar2 == (symbol *)0x0)) || ((*(uint *)psVar2 >> 8 & 2) == 0)) goto LAB_001237dc;
      if (((undefined1  [232])*psVar2 & (undefined1  [232])0xff) == (undefined1  [232])0x11) break;
      if ((size & 0x3c1U) != 0) goto LAB_001237dc;
      size = size | 3;
      (ctx->ctype).base_type = (psVar2->field_14).field_2.ctype.base_type;
      apply_ctype(C,(position)(ctx_local->ctype).modifiers,&(psVar2->field_14).field_2.ctype,
                  &ctx->ctype);
      ctx_local = (decl_state *)(ctx_local->ctype).alignment;
    }
    if ((psVar2->op->type & KW_SPECIFIER) != 0) {
      if ((size & psVar2->op->test) != 0) {
        specifier_conflict(C,(position)(ctx_local->ctype).modifiers,size & psVar2->op->test,
                           (ident *)(ctx_local->ctype).contexts);
LAB_001237dc:
        if ((size & 2U) == 0) {
          type = &C->S->incomplete_ctype;
          if ((size & 0x3c1U) != 0) {
            type = C->P->types[local_30][s._4_4_];
          }
          (ctx->ctype).base_type = type;
        }
        if (((ctx->ctype).modifiers & 0x80000000) != 0) {
          (ctx->ctype).modifiers = (ctx->ctype).modifiers & 0x7fffffff;
          iVar1 = dmrC_is_int_type(C->S,(ctx->ctype).base_type);
          if (iVar1 == 0) {
            dmrC_sparse_error(C,(position)(ctx_local->ctype).modifiers,"invalid modifier");
          }
          else {
            psVar2 = dmrC_alloc_symbol(C->S,(position)(ctx_local->ctype).modifiers,2);
            memcpy(psVar2,(ctx->ctype).base_type,0xe8);
            (psVar2->field_14).field_2.ctype.modifiers =
                 (psVar2->field_14).field_2.ctype.modifiers & 0xffffffffbfffe03f;
            (psVar2->field_14).field_2.ctype.base_type = (ctx->ctype).base_type;
            *(uint *)psVar2 = *(uint *)psVar2 & 0xffffff00 | 0xf;
            (ctx->ctype).base_type = psVar2;
            dmrC_create_fouled(C->S,psVar2);
          }
        }
        return (token *)ctx_local;
      }
      size = psVar2->op->set | size;
      local_30 = psVar2->op->cls + local_30;
      if ((psVar2->op->set & 0x800U) != 0) {
        s._4_4_ = 2;
      }
      if ((psVar2->op->type & KW_SHORT) == 0) {
        if (((psVar2->op->type & KW_LONG) != 0) &&
           (iVar1 = s._4_4_ + 1, bVar3 = s._4_4_ != 0, s._4_4_ = iVar1, bVar3)) {
          if (local_30 == 3) {
            specifier_conflict(C,(position)(ctx_local->ctype).modifiers,0x400,C->S->double_ident);
            goto LAB_001237dc;
          }
          size = size | 0x400;
        }
      }
      else {
        s._4_4_ = -1;
      }
    }
    ctx_local = (decl_state *)(ctx_local->ctype).alignment;
    if (psVar2->op->declarator != (_func_token_ptr_dmr_C_ptr_token_ptr_decl_state_ptr *)0x0) {
      ctx_local = (decl_state *)(*psVar2->op->declarator)(C,(token *)ctx_local,ctx);
    }
    if ((psVar2->op->type & KW_EXACT) != 0) {
      (ctx->ctype).base_type = (psVar2->field_14).field_2.ctype.base_type;
      (ctx->ctype).modifiers = (psVar2->field_14).field_2.ctype.modifiers | (ctx->ctype).modifiers;
    }
  } while( true );
}

Assistant:

static struct token *declaration_specifiers(struct dmr_C *C, struct token *token, struct decl_state *ctx)
{
	int seen = 0;
	int cls = CInt;
	int size = 0;

	while (dmrC_token_type(token) == TOKEN_IDENT) {
		struct symbol *s = dmrC_lookup_symbol(token->ident,
						 NS_TYPEDEF | NS_SYMBOL);
		if (!s || !(s->ns & NS_TYPEDEF))
			break;
		if (s->type != SYM_KEYWORD) {
			if (seen & Set_Any)
				break;
			seen |= Set_S | Set_T;
			ctx->ctype.base_type = s->ctype.base_type;
			apply_ctype(C, token->pos, &s->ctype, &ctx->ctype);
			token = token->next;
			continue;
		}
		if (s->op->type & KW_SPECIFIER) {
			if (seen & s->op->test) {
				specifier_conflict(C, token->pos,
						   seen & s->op->test,
						   token->ident);
				break;
			}
			seen |= s->op->set;
			cls += s->op->cls;
			if (s->op->set & Set_Int128)
				size = 2;
			if (s->op->type & KW_SHORT) {
				size = -1;
			} else if (s->op->type & KW_LONG && size++) {
				if (cls == CReal) {
					specifier_conflict(C, token->pos,
							   Set_Vlong,
							   C->S->double_ident);
					break;
				}
				seen |= Set_Vlong;
			}
		}
		token = token->next;
		if (s->op->declarator)
			token = s->op->declarator(C, token, ctx);
		if (s->op->type & KW_EXACT) {
			ctx->ctype.base_type = s->ctype.base_type;
			ctx->ctype.modifiers |= s->ctype.modifiers;
		}
	}

	if (!(seen & Set_S)) {	/* not set explicitly? */
		struct symbol *base = &C->S->incomplete_ctype;
		if (seen & Set_Any)
			base = C->P->types[cls][size];
		ctx->ctype.base_type = base;
	}

	if (ctx->ctype.modifiers & MOD_BITWISE) {
		struct symbol *type;
		ctx->ctype.modifiers &= ~MOD_BITWISE;
		if (!dmrC_is_int_type(C->S, ctx->ctype.base_type)) {
			dmrC_sparse_error(C, token->pos, "invalid modifier");
			return token;
		}
		type = dmrC_alloc_symbol(C->S, token->pos, SYM_BASETYPE);
		*type = *ctx->ctype.base_type;
		type->ctype.modifiers &= ~MOD_SPECIFIER;
		type->ctype.base_type = ctx->ctype.base_type;
		type->type = SYM_RESTRICT;
		ctx->ctype.base_type = type;
		dmrC_create_fouled(C->S, type);
	}
	return token;
}